

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
TransformPromiseNode<kj::HttpClient::WebSocketResponse,_kj::HttpClient::Response,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3355:22),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::HttpClient::WebSocketResponse,_kj::HttpClient::Response,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:3355:22),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  Exception *in;
  ExceptionOr<kj::HttpClient::WebSocketResponse> *pEVar1;
  Response *func;
  Response *in_RCX;
  WebSocketResponse local_6a0;
  ExceptionOr<kj::HttpClient::WebSocketResponse> local_668;
  Response *local_4c8;
  Response *depValue;
  ExceptionOr<kj::HttpClient::WebSocketResponse> local_368;
  Exception *local_1c8;
  Exception *depException;
  undefined1 local_1b0 [8];
  ExceptionOr<kj::HttpClient::Response> depResult;
  ExceptionOrValue *output_local;
  TransformPromiseNode<kj::HttpClient::WebSocketResponse,_kj::HttpClient::Response,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_c__:3355:22),_kj::_::PropagateException>
  *this_local;
  
  depResult.value.ptr.field_1.value.body.ptr = (AsyncInputStream *)output;
  ExceptionOr<kj::HttpClient::Response>::ExceptionOr
            ((ExceptionOr<kj::HttpClient::Response> *)local_1b0);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1b0);
  local_1c8 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1b0);
  if (local_1c8 == (Exception *)0x0) {
    local_4c8 = readMaybe<kj::HttpClient::Response>
                          ((Maybe<kj::HttpClient::Response> *)
                           ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 + 0x150));
    if (local_4c8 != (Response *)0x0) {
      func = mv<kj::HttpClient::Response>(local_4c8);
      MaybeVoidCaller<kj::HttpClient::Response,kj::HttpClient::WebSocketResponse>::
      apply<kj::HttpClient::openWebSocket(kj::StringPtr,kj::HttpHeaders_const&)::__0>
                (&local_6a0,
                 (MaybeVoidCaller<kj::HttpClient::Response,kj::HttpClient::WebSocketResponse> *)
                 &this->field_0x20,(Type *)func,in_RCX);
      handle(&local_668,this,&local_6a0);
      pEVar1 = ExceptionOrValue::as<kj::HttpClient::WebSocketResponse>
                         ((ExceptionOrValue *)depResult.value.ptr.field_1.value.body.ptr);
      ExceptionOr<kj::HttpClient::WebSocketResponse>::operator=(pEVar1,&local_668);
      ExceptionOr<kj::HttpClient::WebSocketResponse>::~ExceptionOr(&local_668);
      HttpClient::WebSocketResponse::~WebSocketResponse(&local_6a0);
    }
  }
  else {
    in = mv<kj::Exception>(local_1c8);
    MaybeVoidCaller<kj::Exception,_kj::_::PropagateException::Bottom>::
    apply<kj::_::PropagateException>((Bottom *)&depValue,(PropagateException *)&this->field_0x21,in)
    ;
    handle(&local_368,this,(Bottom *)&depValue);
    pEVar1 = ExceptionOrValue::as<kj::HttpClient::WebSocketResponse>
                       ((ExceptionOrValue *)depResult.value.ptr.field_1.value.body.ptr);
    ExceptionOr<kj::HttpClient::WebSocketResponse>::operator=(pEVar1,&local_368);
    ExceptionOr<kj::HttpClient::WebSocketResponse>::~ExceptionOr(&local_368);
    PropagateException::Bottom::~Bottom((Bottom *)&depValue);
  }
  ExceptionOr<kj::HttpClient::Response>::~ExceptionOr
            ((ExceptionOr<kj::HttpClient::Response> *)local_1b0);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }